

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableArgumentsArrayWalker::RecyclableArgumentsArrayWalker
          (RecyclableArgumentsArrayWalker *this,ScriptContext *_scriptContext,Var _instance,
          Var _originalInstance)

{
  Var _originalInstance_local;
  Var _instance_local;
  ScriptContext *_scriptContext_local;
  RecyclableArgumentsArrayWalker *this_local;
  
  RecyclableArrayWalker::RecyclableArrayWalker
            (&this->super_RecyclableArrayWalker,_scriptContext,_instance,_originalInstance);
  (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.super_IDiagObjectModelWalkerBase.
  _vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_01deac60;
  this->pFormalsList =
       (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  return;
}

Assistant:

RecyclableArgumentsArrayWalker::RecyclableArgumentsArrayWalker(ScriptContext* _scriptContext, Var _instance, Var _originalInstance)
        : RecyclableArrayWalker(_scriptContext, _instance, _originalInstance), pFormalsList(nullptr)
    {
    }